

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<unsigned_int,3ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<unsigned_int,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,_3UL>_>_>_>
          *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  char c;
  array<unsigned_int,_3UL> value;
  char local_5d;
  array<unsigned_int,_3UL> local_5c;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (*(long *)(result + 8) != *(long *)result) {
    *(long *)(result + 8) = *(long *)result;
  }
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    bVar2 = MaybeNone(this);
    if (bVar2) {
      local_50._0_4_ = local_50._0_4_ & 0xffffff00;
      local_50._4_4_ = (anon_struct_4_0_00000001_for___align)0x0;
      local_50._8_4_ = 0;
      local_50._12_4_ = 0;
      ::std::
      vector<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>>
      ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>
                ((vector<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>>
                  *)result,(optional<std::array<unsigned_int,_3UL>_> *)local_50);
    }
    else {
      bVar2 = ParseBasicTypeTuple<unsigned_int,3ul>(this,&local_5c);
      if (bVar2) {
        local_50[0] = true;
        local_50._4_4_ = local_5c._M_elems[0];
        local_50._8_4_ = local_5c._M_elems[1];
        local_50._12_4_ = local_5c._M_elems[2];
        ::std::
        vector<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>>
        ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>
                  ((vector<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>>
                    *)result,(optional<std::array<unsigned_int,_3UL>_> *)local_50);
      }
      else {
        local_50._0_8_ = &local_40;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Not starting with the tuple value of requested type.\n","");
        PushError(this,(string *)local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._0_8_ != &local_40) {
          operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
        }
      }
      if (!bVar2) {
        return false;
      }
    }
    do {
      pSVar1 = this->_sr;
      if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
      goto LAB_0038e004;
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      bVar2 = Char1(this,&local_5d);
      iVar4 = 1;
      if (bVar2) {
        if (local_5d == sep) {
          bVar2 = SkipWhitespaceAndNewline(this,true);
          if (bVar2) {
            bVar2 = MaybeNone(this);
            if (bVar2) {
              local_50._0_4_ = local_50._0_4_ & 0xffffff00;
              local_50._12_4_ = 0;
              local_50._4_4_ = (anon_struct_4_0_00000001_for___align)0x0;
              local_50._8_4_ = 0;
              ::std::
              vector<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>>
              ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>
                        ((vector<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>>
                          *)result,(optional<std::array<unsigned_int,_3UL>_> *)local_50);
            }
            else {
              bVar2 = ParseBasicTypeTuple<unsigned_int,3ul>(this,&local_5c);
              iVar4 = 3;
              if (!bVar2) goto LAB_0038dff5;
              local_50[0] = 1;
              local_50._12_4_ = local_5c._M_elems[2];
              local_50._4_4_ = local_5c._M_elems[0];
              local_50._8_4_ = local_5c._M_elems[1];
              ::std::
              vector<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>>
              ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>
                        ((vector<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>>>
                          *)result,(optional<std::array<unsigned_int,_3UL>_> *)local_50);
            }
            iVar4 = 0;
          }
        }
        else {
          pSVar1 = this->_sr;
          iVar4 = 3;
          if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_)) {
            pSVar1->idx_ = uVar3;
          }
        }
      }
LAB_0038dff5:
    } while (iVar4 == 0);
    if (iVar4 != 1) {
LAB_0038e004:
      if (*(long *)result != *(long *)(result + 8)) {
        return true;
      }
      local_50._0_8_ = &local_40;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Empty array.\n","");
      PushError(this,(string *)local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._0_8_ != &local_40) {
        operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}